

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_Xform * operator*(ON_Xform *__return_storage_ptr__,double c,ON_Xform *xform)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  
  pdVar4 = (double *)__return_storage_ptr__;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar4 = *(double *)xform;
    xform = (ON_Xform *)((long)xform + 8);
    pdVar4 = pdVar4 + 1;
  }
  lVar3 = 0;
  do {
    pdVar4 = __return_storage_ptr__->m_xform[0] + lVar3;
    dVar2 = pdVar4[1];
    pdVar1 = __return_storage_ptr__->m_xform[0] + lVar3;
    *pdVar1 = *pdVar4 * c;
    pdVar1[1] = dVar2 * c;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x10);
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform operator*(double c, const ON_Xform& xform)
{
  ON_Xform cx(xform);
  double* p = &cx.m_xform[0][0];
  double* p1 = p + 16;
  while (p < p1)
  {
    const double x = *p;
    *p++ = c*x;
  }
  return cx;
}